

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

agr * __thiscall agr::getCommandOut_abi_cxx11_(agr *this,char *command)

{
  bool bVar1;
  FILE *pFVar2;
  runtime_error *this_00;
  pointer pvVar3;
  size_type sVar4;
  char *pcVar5;
  _func_int__IO_FILE_ptr *local_c8 [3];
  undefined1 local_b0 [8];
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> pipe;
  undefined1 local_98 [8];
  array<char,_128UL> buffer;
  char *command_local;
  string *result;
  
  pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl._7_1_ = 0;
  buffer._M_elems._120_8_ = command;
  std::__cxx11::string::string((string *)this);
  pFVar2 = popen((char *)buffer._M_elems._120_8_,"r");
  local_c8[0] = pclose;
  std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)local_b0,(pointer)pFVar2,local_c8);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_b0);
  if (bVar1) {
    while( true ) {
      pvVar3 = std::array<char,_128UL>::data((array<char,_128UL> *)local_98);
      sVar4 = std::array<char,_128UL>::size((array<char,_128UL> *)local_98);
      pFVar2 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_b0);
      pcVar5 = fgets(pvVar3,(int)sVar4,pFVar2);
      if (pcVar5 == (char *)0x0) break;
      pvVar3 = std::array<char,_128UL>::data((array<char,_128UL> *)local_98);
      std::__cxx11::string::operator+=((string *)this,pvVar3);
    }
    pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>
    ._M_head_impl._7_1_ = 1;
    std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr
              ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_b0);
    if ((pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)this);
    }
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"popen() failed!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string getCommandOut( const char* command ) 
   {
    std::array<char, 128> buffer;
    std::string result;
    #ifdef _WIN32
      std::unique_ptr<FILE, decltype( & _pclose )> pipe( _popen( command, "r" ), _pclose );
    #else
      std::unique_ptr<FILE, decltype( & pclose )> pipe( popen( command, "r" ), pclose );
    #endif

    if ( ! pipe ) 
     {
      throw std::runtime_error( "popen() failed!" );
     }

    while ( fgets( buffer.data(), buffer.size(), pipe.get() ) != nullptr ) 
     {
      result += buffer.data();
     }

    return result;
   }